

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O0

bool __thiscall
cmCursesOptionsWidget::HandleInput
          (cmCursesOptionsWidget *this,int *key,cmCursesMainForm *param_2,WINDOW *w)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int p1;
  int *piVar5;
  int local_64;
  int local_54;
  int local_44;
  WINDOW *w_local;
  cmCursesMainForm *param_2_local;
  int *key_local;
  cmCursesOptionsWidget *this_local;
  
  if ((*key == 10) || (*key == 0x157)) {
    NextOption(this);
    if (w == (WINDOW *)0x0) {
      local_44 = -1;
    }
    else {
      local_44 = w->_maxy + 1;
    }
    wtouchln(w,0,local_44,1);
    wrefresh(w);
  }
  else {
    if (*key != 0x104) {
      uVar1 = *key;
      piVar5 = key;
      uVar3 = ctrl((EVP_PKEY_CTX *)0x62,(int)key,(int)param_2,w);
      if (uVar1 != uVar3) {
        if ((*key != 0x105) &&
           (iVar2 = *key, iVar4 = ctrl((EVP_PKEY_CTX *)0x66,(int)piVar5,p1,(void *)(ulong)uVar3),
           iVar2 != iVar4)) {
          return false;
        }
        NextOption(this);
        if (w == (WINDOW *)0x0) {
          local_64 = -1;
        }
        else {
          local_64 = w->_maxy + 1;
        }
        wtouchln(w,0,local_64,1);
        wrefresh(w);
        return true;
      }
    }
    if (w == (WINDOW *)0x0) {
      local_54 = -1;
    }
    else {
      local_54 = w->_maxy + 1;
    }
    wtouchln(w,0,local_54,1);
    wrefresh(w);
    PreviousOption(this);
  }
  return true;
}

Assistant:

bool cmCursesOptionsWidget::HandleInput(int& key, cmCursesMainForm*, WINDOW* w)
{

  // 10 == enter
  if (key == 10 || key == KEY_ENTER)
    {
    this->NextOption();
    touchwin(w);
    wrefresh(w);
    return true;
    }
  else if (key == KEY_LEFT || key == ctrl('b'))
    {
    touchwin(w);
    wrefresh(w);
    this->PreviousOption();
    return true;
    }
  else if (key == KEY_RIGHT || key == ctrl('f'))
    {
    this->NextOption();
    touchwin(w);
    wrefresh(w);
    return true;
    }
  else
    {
    return false;
    }
}